

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O2

unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
__thiscall duckdb::BoundOrderModifier::Copy(BoundOrderModifier *this)

{
  BoundOrderByNode *pBVar1;
  pointer pBVar2;
  long in_RSI;
  BoundOrderByNode *this_00;
  BoundOrderByNode local_40;
  
  make_uniq<duckdb::BoundOrderModifier>();
  pBVar1 = *(BoundOrderByNode **)(in_RSI + 0x18);
  for (this_00 = *(BoundOrderByNode **)(in_RSI + 0x10); this_00 != pBVar1; this_00 = this_00 + 1) {
    pBVar2 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
             ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                           *)this);
    BoundOrderByNode::Copy(&local_40,this_00);
    ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
    emplace_back<duckdb::BoundOrderByNode>
              (&(pBVar2->orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
               &local_40);
    BoundOrderByNode::~BoundOrderByNode(&local_40);
  }
  return (unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>)
         (unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>)
         this;
}

Assistant:

unique_ptr<BoundOrderModifier> BoundOrderModifier::Copy() const {
	auto result = make_uniq<BoundOrderModifier>();
	for (auto &order : orders) {
		result->orders.push_back(order.Copy());
	}
	return result;
}